

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O0

void secp256k1_fe_impl_sqr(secp256k1_fe *r,secp256k1_fe *a)

{
  uint64_t *in_stack_00000068;
  uint64_t *in_stack_00000070;
  
  secp256k1_fe_sqr_inner(in_stack_00000070,in_stack_00000068);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_impl_sqr(secp256k1_fe *r, const secp256k1_fe *a) {
    secp256k1_fe_sqr_inner(r->n, a->n);
}